

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

bool __thiscall Json::Value::isInt64(Value *this)

{
  double d;
  bool bVar1;
  longlong val;
  longlong local_40;
  string local_38;
  
  bVar1 = true;
  switch(this->field_0x8) {
  case 1:
  case 3:
    break;
  case 2:
    bVar1 = -1 < (this->value_).int_;
    break;
  case 4:
    d = (this->value_).real_;
    bVar1 = false;
    if ((-9.223372036854776e+18 <= d) && (d < 9.223372036854776e+18)) {
      bVar1 = IsIntegral(d);
      return bVar1;
    }
    break;
  case 5:
    asString_abi_cxx11_(&local_38,this);
    bVar1 = converToInt64(local_38._M_dataplus._M_p,&local_40);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      return true;
    }
  default:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Value::isInt64() const {
#if defined(JSON_HAS_INT64)
  switch (type_) {
  case int64Value:
  case intValue:
    return true;
  case uintValue:
    return value_.uint_ <= UInt64(maxInt64);
  case realValue:
    // Note that maxInt64 (= 2^63 - 1) is not exactly representable as a
    // double, so double(maxInt64) will be rounded up to 2^63. Therefore we
    // require the value to be strictly less than the limit.
    return value_.real_ >= double(minInt64) &&
           value_.real_ < double(maxInt64) && IsIntegral(value_.real_);
  case stringValue:
    long long int val;

    if (!converToInt64 (asString().c_str(), &val)) {
      break;
    }

    return IsInRange (val, minInt64, maxInt64);
  default:
    break;
  }
#endif // JSON_HAS_INT64
  return false;
}